

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat
          (DescriptorIndex *this,string_view name)

{
  string_view super_symbol;
  bool bVar1;
  pointer pSVar2;
  const_reference this_00;
  Value VVar3;
  pair<const_void_*,_int> pVar4;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  local_48;
  SymbolCompare local_40;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  local_38;
  const_iterator iter;
  DescriptorIndex *this_local;
  string_view name_local;
  int local_10;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorIndex *)name._M_len;
  iter._M_current = (SymbolEntry *)this;
  local_40.index =
       (DescriptorIndex *)
       absl::lts_20250127::container_internal::
       btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
       ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                   *)&this->by_symbol_);
  local_38._M_current =
       (SymbolEntry *)
       protobuf::(anonymous_namespace)::
       FindLastLessOrEqual<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                 (&this->by_symbol_flat_,
                  (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_40);
  local_48._M_current =
       (SymbolEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
       ::end(&this->by_symbol_flat_);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
  if (bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
             ::operator->(&local_38);
    super_symbol._M_str = (char *)name_local._M_len;
    super_symbol._M_len = (size_t)this_local;
    bVar1 = SymbolEntry::IsSubSymbolOf(pSVar2,this,super_symbol);
    if (bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
               ::operator->(&local_38);
      this_00 = std::
                vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ::operator[](&this->all_values_,(long)pSVar2->data_offset);
      VVar3 = EncodedEntry::value(this_00);
      name_local._M_str = (char *)VVar3.first;
      local_10 = VVar3.second;
      goto LAB_006b4a5d;
    }
  }
  std::pair<const_void_*,_int>::pair<const_void_*,_int,_true>
            ((pair<const_void_*,_int> *)&name_local._M_str);
LAB_006b4a5d:
  pVar4.second = local_10;
  pVar4.first = name_local._M_str;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat(
    absl::string_view name) const {
  auto iter =
      FindLastLessOrEqual(&by_symbol_flat_, name, by_symbol_.key_comp());

  return iter != by_symbol_flat_.end() && iter->IsSubSymbolOf(*this, name)
             ? all_values_[iter->data_offset].value()
             : Value();
}